

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O3

bool from_issue_145::
     test_uintwide_t_spot_values_from_issue_145<math::wide_integer::uintwide_t<128u,unsigned_int,void,false>>
               (uintwide_t<128U,_unsigned_int,_void,_false> *x)

{
  undefined8 uVar1;
  undefined8 uVar2;
  unsigned_fast_type i;
  long lVar3;
  uintwide_t<128U,_unsigned_int,_void,_false> *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  local_unknown_integer_type a;
  uintwide_t<128U,_unsigned_int,_void,_false> self;
  uint local_28 [4];
  uintwide_t<128U,_unsigned_int,_void,_false> local_18;
  
  uVar1 = *(undefined8 *)(x->values).super_array<unsigned_int,_4UL>.elems;
  uVar2 = *(undefined8 *)((x->values).super_array<unsigned_int,_4UL>.elems + 2);
  local_28[0] = (uint)uVar1;
  local_28[1] = (uint)((ulong)uVar1 >> 0x20);
  local_28[2] = (uint)uVar2;
  local_28[3] = (uint)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(x->values).super_array<unsigned_int,_4UL>.elems;
  uVar2 = *(undefined8 *)((x->values).super_array<unsigned_int,_4UL>.elems + 2);
  local_18.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar1;
  local_18.values.super_array<unsigned_int,_4UL>.elems[1] =
       (value_type_conflict)((ulong)uVar1 >> 0x20);
  local_18.values.super_array<unsigned_int,_4UL>.elems[2] = (value_type_conflict)uVar2;
  local_18.values.super_array<unsigned_int,_4UL>.elems[3] =
       (value_type_conflict)((ulong)uVar2 >> 0x20);
  lVar3 = 0;
  uVar5 = 0;
  do {
    uVar5 = (ulong)local_18.values.super_array<unsigned_int,_4UL>.elems[lVar3] +
            local_28[lVar3] + uVar5;
    local_28[lVar3] = (uint)uVar5;
    uVar5 = uVar5 >> 0x20;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_18.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[0] = 2;
  puVar4 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator*=(&local_18,x);
  uVar1 = *(undefined8 *)(puVar4->values).super_array<unsigned_int,_4UL>.elems;
  uVar2 = *(undefined8 *)((puVar4->values).super_array<unsigned_int,_4UL>.elems + 2);
  local_18.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar1;
  local_18.values.super_array<unsigned_int,_4UL>.elems[1] =
       (value_type_conflict)((ulong)uVar1 >> 0x20);
  local_18.values.super_array<unsigned_int,_4UL>.elems[2] = (value_type_conflict)uVar2;
  local_18.values.super_array<unsigned_int,_4UL>.elems[3] =
       (value_type_conflict)((ulong)uVar2 >> 0x20);
  lVar3 = 0xc;
  do {
    lVar6 = lVar3;
    if (lVar6 == -4) break;
    lVar3 = lVar6 + -4;
  } while (*(int *)((long)local_28 + lVar6) ==
           *(int *)((long)local_18.values.super_array<unsigned_int,_4UL>.elems + lVar6));
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[0] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  lVar3 = 0xc;
  do {
    lVar7 = lVar3;
    if (lVar7 == -4) break;
    lVar3 = lVar7 + -4;
  } while (*(int *)((long)local_28 + lVar7) ==
           *(int *)((long)local_18.values.super_array<unsigned_int,_4UL>.elems + lVar7));
  local_28[0] = 1;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_18.values.super_array<unsigned_int,_4UL>.elems[0] = 1;
  lVar3 = 0xc;
  do {
    lVar8 = lVar3;
    if (lVar8 == -4) break;
    lVar3 = lVar8 + -4;
  } while (*(int *)((long)local_28 + lVar8) ==
           *(int *)((long)local_18.values.super_array<unsigned_int,_4UL>.elems + lVar8));
  return (lVar6 == -4 && lVar7 == -4) && lVar8 == -4;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_145(const UnknownIntegerType& x) -> bool
  {
    // See also https://github.com/ckormanyos/wide-integer/issues/145#issuecomment-1006374713

    using local_unknown_integer_type = UnknownIntegerType;

    bool local_result_is_ok = true;

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wself-assign-overloaded"
    #endif

    {
      local_unknown_integer_type a = x; a += a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == (2U * x)) && local_result_is_ok);
    }

    {
      local_unknown_integer_type a = x; a -= a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == 0U) && local_result_is_ok);
    }

    {
      local_unknown_integer_type a = x; a /= a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == 1U) && local_result_is_ok);
    }

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic pop
    #endif

    return local_result_is_ok;
  }